

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O0

void thread_rwlock_trylock_peer(void *unused)

{
  int iVar1;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  void *unused_local;
  
  uv_mutex_lock(&mutex);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if ((long)iVar1 != -0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0x72,"UV_EBUSY","==","uv_rwlock_tryrdlock(&rwlock)",0xfffffffffffffff0,"==",(long)iVar1
           );
    abort();
  }
  iVar1 = uv_rwlock_trywrlock(&rwlock);
  if ((long)iVar1 != -0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0x73,"UV_EBUSY","==","uv_rwlock_trywrlock(&rwlock)",0xfffffffffffffff0,"==",(long)iVar1
           );
    abort();
  }
  synchronize();
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0x77,"uv_rwlock_tryrdlock(&rwlock)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_rwlock_rdunlock(&rwlock);
  iVar1 = uv_rwlock_trywrlock(&rwlock);
  if ((long)iVar1 != -0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0x79,"UV_EBUSY","==","uv_rwlock_trywrlock(&rwlock)",0xfffffffffffffff0,"==",(long)iVar1
           );
    abort();
  }
  synchronize();
  iVar1 = uv_rwlock_trywrlock(&rwlock);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0x7d,"uv_rwlock_trywrlock(&rwlock)","==","0",(long)iVar1,"==",0);
    abort();
  }
  synchronize();
  uv_rwlock_wrunlock(&rwlock);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0x82,"uv_rwlock_tryrdlock(&rwlock)","==","0",(long)iVar1,"==",0);
    abort();
  }
  synchronize();
  uv_rwlock_rdunlock(&rwlock);
  synchronize_nowait();
  uv_mutex_unlock(&mutex);
  return;
}

Assistant:

static void thread_rwlock_trylock_peer(void* unused) {
  (void) &unused;

  uv_mutex_lock(&mutex);

  /* Write lock held by other thread. */
  ASSERT_EQ(UV_EBUSY, uv_rwlock_tryrdlock(&rwlock));
  ASSERT_EQ(UV_EBUSY, uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Read lock held by other thread. */
  ASSERT_OK(uv_rwlock_tryrdlock(&rwlock));
  uv_rwlock_rdunlock(&rwlock);
  ASSERT_EQ(UV_EBUSY, uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Acquire write lock. */
  ASSERT_OK(uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Release write lock and acquire read lock. */
  uv_rwlock_wrunlock(&rwlock);
  ASSERT_OK(uv_rwlock_tryrdlock(&rwlock));
  synchronize();

  uv_rwlock_rdunlock(&rwlock);
  synchronize_nowait();  /* Signal main thread we're going away. */
  uv_mutex_unlock(&mutex);
}